

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from)

{
  ThreadSafeArena *this_00;
  long *plVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  void **ppvVar5;
  RepeatedPtrFieldBase *pRVar6;
  Rep *pRVar7;
  string *psVar8;
  undefined8 extraout_RAX;
  int iVar9;
  int iVar10;
  long lVar11;
  int extend_amount;
  RepeatedPtrFieldBase *pRVar12;
  
  if (from == this) {
    MergeFrom<std::__cxx11::string>();
    operator_delete(from,0x20);
    _Unwind_Resume(extraout_RAX);
  }
  iVar9 = this->current_size_;
  iVar10 = from->current_size_ + iVar9;
  iVar3 = this->capacity_proxy_ + 1;
  extend_amount = iVar10 - iVar3;
  if (extend_amount == 0 || iVar10 < iVar3) {
    pRVar6 = this;
    if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
      pRVar7 = rep(this);
      pRVar6 = (RepeatedPtrFieldBase *)pRVar7->elements;
      iVar9 = this->current_size_;
    }
    ppvVar5 = &pRVar6->tagged_rep_or_elem_ + iVar9;
  }
  else {
    ppvVar5 = InternalExtend(this,extend_amount);
  }
  pRVar6 = from;
  if (((ulong)from->tagged_rep_or_elem_ & 1) != 0) {
    pRVar7 = rep(from);
    pRVar6 = (RepeatedPtrFieldBase *)pRVar7->elements;
  }
  iVar9 = from->current_size_;
  lVar11 = (long)iVar9;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar4 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar7 = rep(this);
    uVar4 = pRVar7->allocated_size;
    iVar9 = from->current_size_;
  }
  iVar3 = uVar4 - this->current_size_;
  if (iVar9 < iVar3) {
    iVar3 = iVar9;
  }
  pRVar12 = pRVar6;
  if (0 < iVar3) {
    do {
      std::__cxx11::string::_M_assign((string *)*ppvVar5);
      ppvVar5 = ppvVar5 + 1;
      pRVar12 = (RepeatedPtrFieldBase *)&pRVar12->current_size_;
    } while (pRVar12 < &pRVar6->tagged_rep_or_elem_ + iVar3);
  }
  this_00 = &this->arena_->impl_;
  if (this_00 == (ThreadSafeArena *)0x0) {
    for (; pRVar12 < (RepeatedPtrFieldBase *)(&pRVar6->tagged_rep_or_elem_ + lVar11);
        pRVar12 = (RepeatedPtrFieldBase *)&pRVar12->current_size_) {
      psVar8 = (string *)operator_new(0x20);
      plVar1 = (long *)pRVar12->tagged_rep_or_elem_;
      *(string **)psVar8 = psVar8 + 0x10;
      lVar2 = *plVar1;
      std::__cxx11::string::_M_construct<char*>(psVar8,lVar2,plVar1[1] + lVar2);
      *ppvVar5 = psVar8;
      ppvVar5 = ppvVar5 + 1;
    }
  }
  else {
    for (; pRVar12 < (RepeatedPtrFieldBase *)(&pRVar6->tagged_rep_or_elem_ + lVar11);
        pRVar12 = (RepeatedPtrFieldBase *)&pRVar12->current_size_) {
      plVar1 = (long *)pRVar12->tagged_rep_or_elem_;
      psVar8 = (string *)ThreadSafeArena::AllocateFromStringBlock(this_00);
      *(string **)psVar8 = psVar8 + 0x10;
      lVar2 = *plVar1;
      std::__cxx11::string::_M_construct<char*>(psVar8,lVar2,plVar1[1] + lVar2);
      *ppvVar5 = psVar8;
      ppvVar5 = ppvVar5 + 1;
    }
  }
  this->current_size_ = iVar10;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar4 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar7 = rep(this);
    uVar4 = pRVar7->allocated_size;
  }
  if ((int)uVar4 < iVar10) {
    pRVar7 = rep(this);
    pRVar7->allocated_size = iVar10;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFrom<std::string>(
    const RepeatedPtrFieldBase& from) {
  Prefetch5LinesFrom1Line(&from);
  ABSL_DCHECK_NE(&from, this);
  int new_size = current_size_ + from.current_size_;
  auto dst = reinterpret_cast<std::string**>(InternalReserve(new_size));
  auto src = reinterpret_cast<std::string* const*>(from.elements());
  auto end = src + from.current_size_;
  auto end_assign = src + std::min(ClearedCount(), from.current_size_);
  for (; src < end_assign; ++dst, ++src) {
    (*dst)->assign(**src);
  }
  if (Arena* const arena = arena_) {
    for (; src < end; ++dst, ++src) {
      *dst = Arena::Create<std::string>(arena, **src);
    }
  } else {
    for (; src < end; ++dst, ++src) {
      *dst = new std::string(**src);
    }
  }
  ExchangeCurrentSize(new_size);
  if (new_size > allocated_size()) {
    rep()->allocated_size = new_size;
  }
}